

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_url_encode(char *src,size_t s_len,char *dst,size_t dst_len)

{
  ushort **ppuVar1;
  void *pvVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (s_len == 0 || dst_len == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    uVar5 = 0;
    do {
      if (dst_len - 1 <= uVar4 + 2) break;
      ppuVar1 = __ctype_b_loc();
      bVar3 = src[uVar5];
      if ((((*ppuVar1)[bVar3] & 8) == 0) &&
         (pvVar2 = memchr("._-$,;~()",(uint)bVar3,10), pvVar2 == (void *)0x0)) {
        if (uVar4 + 3 < dst_len) {
          dst[uVar4] = '%';
          dst[uVar4 + 1] = "0123456789abcdef"[(byte)src[uVar5] >> 4];
          bVar3 = "0123456789abcdef"[(byte)src[uVar5] & 0xf];
          uVar4 = uVar4 + 2;
          goto LAB_00106ca1;
        }
      }
      else {
LAB_00106ca1:
        dst[uVar4] = bVar3;
      }
      uVar5 = uVar5 + 1;
      uVar4 = uVar4 + 1;
    } while (uVar5 < s_len);
  }
  dst[uVar4] = '\0';
  return (int)uVar4;
}

Assistant:

int mg_url_encode(const char *src, size_t s_len, char *dst, size_t dst_len) {
  static const char *dont_escape = "._-$,;~()";
  static const char *hex = "0123456789abcdef";
  size_t i = 0, j = 0;

  for (i = j = 0; dst_len > 0 && i < s_len && j + 2 < dst_len - 1; i++, j++) {
    if (isalnum(* (const unsigned char *) (src + i)) ||
        strchr(dont_escape, * (const unsigned char *) (src + i)) != NULL) {
      dst[j] = src[i];
    } else if (j + 3 < dst_len) {
      dst[j] = '%';
      dst[j + 1] = hex[(* (const unsigned char *) (src + i)) >> 4];
      dst[j + 2] = hex[(* (const unsigned char *) (src + i)) & 0xf];
      j += 2;
    }
  }

  dst[j] = '\0';
  return j;
}